

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O3

set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
* dg::pta::reachableNodes(PSNode *nd)

{
  pointer ppPVar1;
  pointer ppPVar2;
  PSNode **ppPVar3;
  PSNode **ppPVar4;
  PSNode **ppPVar5;
  pointer ppPVar6;
  pointer ppPVar7;
  pointer ppPVar8;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> *__range3;
  pointer ppPVar9;
  PSNode *in_RSI;
  _Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
  *in_RDI;
  PSNode **ppPVar10;
  pair<std::_Rb_tree_iterator<const_dg::pta::PSNode_*>,_bool> pVar11;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> to_process;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> new_to_process;
  PSNode *succ;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> local_78;
  vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_> local_58;
  PSNode *local_40;
  PSNode *local_38;
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(_Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
    **)(in_RDI + 0x18) = in_RDI + 8;
  *(_Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
    **)(in_RDI + 0x20) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  local_38 = in_RSI;
  std::
  _Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
  ::_M_insert_unique<dg::pta::PSNode_const*const&>(in_RDI,&local_38);
  local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (PSNode **)0x0;
  local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (PSNode **)0x0;
  local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (PSNode **)0x0;
  std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::reserve
            (&local_78,4);
  if (local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<dg::pta::PSNode_const*,std::allocator<dg::pta::PSNode_const*>>::
    _M_realloc_insert<dg::pta::PSNode_const*const&>
              ((vector<dg::pta::PSNode_const*,std::allocator<dg::pta::PSNode_const*>> *)&local_78,
               (iterator)
               local_78.
               super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_38);
  }
  else {
    *local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_38;
    local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_58.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (PSNode **)0x0;
      local_58.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (PSNode **)0x0;
      local_58.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (PSNode **)0x0;
      std::vector<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>::reserve
                (&local_58,
                 (long)local_78.
                       super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78.
                       super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      ppPVar2 = local_78.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppPVar10 = local_78.
                 super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppPVar6 = local_78.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppPVar7 = local_78.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppPVar8 = local_78.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_58.
           super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58.
           super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      for (; local_58.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage = ppPVar8,
          local_58.
          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppPVar7,
          local_58.
          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = ppPVar6, ppPVar10 != ppPVar2;
          ppPVar10 = ppPVar10 + 1) {
        ppPVar1 = ((*ppPVar10)->super_SubgraphNode<dg::pta::PSNode>)._successors.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppPVar3 = local_58.
                  super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar4 = local_58.
                  super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppPVar5 = local_58.
                  super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_58.
        super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_78.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_78.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_58.
        super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_78.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        for (ppPVar9 = ((*ppPVar10)->super_SubgraphNode<dg::pta::PSNode>)._successors.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            local_78.
            super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppPVar5,
            local_78.
            super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppPVar4,
            local_78.
            super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start = ppPVar3, ppPVar9 != ppPVar1;
            ppPVar9 = ppPVar9 + 1) {
          local_40 = *ppPVar9;
          pVar11 = std::
                   _Rb_tree<dg::pta::PSNode_const*,dg::pta::PSNode_const*,std::_Identity<dg::pta::PSNode_const*>,std::less<dg::pta::PSNode_const*>,std::allocator<dg::pta::PSNode_const*>>
                   ::_M_insert_unique<dg::pta::PSNode_const*const&>(in_RDI,&local_40);
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (local_58.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_58.
                super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<dg::pta::PSNode_const*,std::allocator<dg::pta::PSNode_const*>>::
              _M_realloc_insert<dg::pta::PSNode_const*const&>
                        ((vector<dg::pta::PSNode_const*,std::allocator<dg::pta::PSNode_const*>> *)
                         &local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_40);
            }
            else {
              *local_58.
               super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = local_40;
              local_58.
              super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_58.
                   super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          ppPVar3 = local_78.
                    super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppPVar4 = local_78.
                    super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppPVar5 = local_78.
                    super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        ppPVar6 = local_78.
                  super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar7 = local_78.
                  super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppPVar8 = local_78.
                  super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_78.
        super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_58.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_78.
        super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_78.
        super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      if (local_58.
          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (PSNode **)0x0) {
        operator_delete(local_58.
                        super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    } while (local_78.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             local_78.
             super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_78.super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (PSNode **)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<const_dg::pta::PSNode_*,_std::allocator<const_dg::pta::PSNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (set<const_dg::pta::PSNode_*,_std::less<const_dg::pta::PSNode_*>,_std::allocator<const_dg::pta::PSNode_*>_>
          *)in_RDI;
}

Assistant:

std::set<const PSNode *> reachableNodes(const PSNode *nd) {
    std::set<const PSNode *> reachable;
    reachable.insert(nd);

    std::vector<const PSNode *> to_process;
    to_process.reserve(4);
    to_process.push_back(nd);

    while (!to_process.empty()) {
        std::vector<const PSNode *> new_to_process;
        new_to_process.reserve(to_process.size());

        for (const PSNode *cur : to_process) {
            for (const PSNode *succ : cur->successors()) {
                if (reachable.insert(succ).second)
                    new_to_process.push_back(succ);
            }
        }

        new_to_process.swap(to_process);
    }

    return reachable;
}